

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O3

aspa_status
aspa_table_notify_clients
          (aspa_table *aspa_table,aspa_record *record,rtr_socket *rtr_socket,
          aspa_operation_type operation_type)

{
  long lVar1;
  aspa_record aVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  aspa_update_fp p_Var6;
  size_t size;
  long in_FS_OFFSET;
  aspa_record rec;
  uint32_t *local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (rtr_socket != (rtr_socket *)0x0 && aspa_table != (aspa_table *)0x0) {
    p_Var6 = aspa_table->update_fp;
    if (record != (aspa_record *)0x0 && p_Var6 != (aspa_update_fp)0x0) {
      uVar3 = record->customer_asn;
      uVar4 = *(undefined4 *)&record->field_0x4;
      uVar5 = record->provider_count;
      aVar2.provider_count = uVar5;
      aVar2._4_4_ = uVar4;
      aVar2.customer_asn = uVar3;
      if ((record->provider_asns == (uint32_t *)0x0) || (record->provider_count == 0)) {
        local_38 = (uint32_t *)0x0;
      }
      else {
        size = record->provider_count << 2;
        local_38 = (uint32_t *)lrtr_malloc(size);
        memcpy(local_38,record->provider_asns,size);
        p_Var6 = aspa_table->update_fp;
      }
      aVar2.provider_asns = local_38;
      (*p_Var6)(aspa_table,aVar2,rtr_socket,operation_type);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (aspa_status)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static enum aspa_status aspa_table_notify_clients(struct aspa_table *aspa_table, struct aspa_record *record,
						  const struct rtr_socket *rtr_socket,
						  const enum aspa_operation_type operation_type)
{
	if (!aspa_table || !rtr_socket)
		return ASPA_ERROR;

	if (aspa_table->update_fp && record) {
		// Realloc in order not to expose internal record
		struct aspa_record rec = *record;

		if (record->provider_asns && record->provider_count > 0) {
			size_t size = sizeof(uint32_t) * record->provider_count;

			rec.provider_asns = lrtr_malloc(size);
			memcpy(rec.provider_asns, record->provider_asns, size);
		} else {
			rec.provider_asns = NULL;
		}

		aspa_table->update_fp(aspa_table, rec, rtr_socket, operation_type);
	}

	return ASPA_SUCCESS;
}